

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

toml_type_t __thiscall
loltoml::v_0_1_1::detail::parser_t<comments_skipper_t>::parse_value
          (parser_t<comments_skipper_t> *this)

{
  char cVar1;
  parser_t<comments_skipper_t> *this_local;
  
  cVar1 = input_stream_t::peek(&this->input);
  if (cVar1 == '\"') {
    parse_string(this);
    this_local._4_4_ = string;
  }
  else if (cVar1 == '\'') {
    parse_literal_string(this);
    this_local._4_4_ = string;
  }
  else if (cVar1 == '[') {
    parse_array(this);
    this_local._4_4_ = array;
  }
  else if (cVar1 == 'f') {
    parse_false(this);
    this_local._4_4_ = boolean;
  }
  else if (cVar1 == 't') {
    parse_true(this);
    this_local._4_4_ = boolean;
  }
  else if (cVar1 == '{') {
    parse_inline_table(this);
    this_local._4_4_ = table;
  }
  else {
    this_local._4_4_ = parse_date_or_number(this);
  }
  return this_local._4_4_;
}

Assistant:

toml_type_t parse_value() {
        switch (input.peek()) {
            case '{': {
                parse_inline_table();
                return toml_type_t::table;
            } break;
            case '[': {
                parse_array();
                return toml_type_t::array;
            } break;
            case '"': {
                parse_string();
                return toml_type_t::string;
            } break;
            case '\'': {
                parse_literal_string();
                return toml_type_t::string;
            } break;
            case 't': {
                parse_true();
                return toml_type_t::boolean;
            } break;
            case 'f': {
                parse_false();
                return toml_type_t::boolean;
            } break;
            default: {
                return parse_date_or_number();
            }
        }
    }